

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O2

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithInternalFT
                   (Wrench *__return_storage_ptr__,Model *model,Traversal *subModelTraversal,
                   SensorsList *sensors,JointPosDoubleArray *jointPos,LinkVelArray *linkVel,
                   LinkAccArray *linkProperAcc,SensorsMeasurements *ftSensorsMeasurements,
                   estimateExternalWrenchesBuffers *bufs)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long link_id;
  long lVar4;
  Twist *pTVar5;
  SpatialMomentum *pSVar6;
  Wrench *pWVar7;
  long lVar8;
  long *plVar9;
  Transform *pTVar10;
  LinkWrenches *this;
  uint uVar11;
  Transform visitedLink_X_child;
  Wrench local_1a8;
  Wrench local_170;
  Wrench local_138;
  Wrench local_d8;
  Twist local_a0 [56];
  SpatialInertia local_68 [56];
  
  iVar2 = iDynTree::Traversal::getNrOfVisitedLinks();
  this = &bufs->b_contacts_subtree;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      SpatialVector<iDynTree::SpatialForceVector>::Zero();
      iDynTree::Wrench::Wrench(__return_storage_ptr__,&local_138.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_138.super_SpatialForceVector);
      return __return_storage_ptr__;
    }
    iDynTree::Traversal::getLink((long)subModelTraversal);
    link_id = iDynTree::Link::getIndex();
    lVar4 = iDynTree::Traversal::getParentLink((long)subModelTraversal);
    pTVar5 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(linkProperAcc,link_id);
    pSVar6 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,link_id);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_1a8,(SpatialAcc *)pTVar5);
    iDynTree::SpatialInertia::operator*(local_68,pTVar5);
    iDynTree::Twist::operator*(local_a0,pSVar6);
    iDynTree::Wrench::operator+(&local_170,&local_1a8);
    getMeasuredWrench(&local_d8,sensors,ftSensorsMeasurements,link_id);
    iDynTree::Wrench::operator-(&local_138,&local_170);
    pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
    iDynTree::Wrench::operator=(pWVar7,(Wrench *)&local_138.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_138.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_d8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_170.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_a0);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_1a8.super_SpatialForceVector);
    for (uVar11 = 0; uVar3 = iDynTree::Model::getNrOfNeighbors((long)model), uVar11 < uVar3;
        uVar11 = uVar11 + 1) {
      lVar8 = iDynTree::Model::getNeighbor((long)model,(uint)link_id);
      cVar1 = iDynTree::Traversal::isParentOf((long)subModelTraversal,link_id);
      if (cVar1 != '\0') {
        iDynTree::Model::getNeighbor((long)model,(uint)link_id);
        plVar9 = (long *)iDynTree::Model::getJoint((long)model);
        pTVar10 = (Transform *)(**(code **)(*plVar9 + 0x50))(plVar9,jointPos,link_id,lVar8);
        iDynTree::Transform::Transform((Transform *)&local_138,pTVar10);
        pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
        iDynTree::LinkWrenches::operator()(this,lVar8);
        iDynTree::Transform::operator*((Transform *)&local_1a8,&local_138);
        iDynTree::Wrench::operator+(&local_170,pWVar7);
        pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
        iDynTree::Wrench::operator=(pWVar7,(Wrench *)&local_170.super_SpatialForceVector);
        iDynTree::SpatialForceVector::~SpatialForceVector(&local_170.super_SpatialForceVector);
        iDynTree::SpatialForceVector::~SpatialForceVector(&local_1a8.super_SpatialForceVector);
      }
    }
  } while (lVar4 != 0);
  pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,link_id);
  iDynTree::Wrench::Wrench(__return_storage_ptr__,pWVar7);
  return __return_storage_ptr__;
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithInternalFT(const Model& model,
                                                           const Traversal& subModelTraversal,
                                                           const SensorsList& sensors,
                                                           const JointPosDoubleArray & jointPos,
                                                           const LinkVelArray& linkVel,
                                                           const LinkAccArray& linkProperAcc,
                                                           const SensorsMeasurements& ftSensorsMeasurements,
                                                                 estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = subModelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v) - getMeasuredWrench(sensors,ftSensorsMeasurements,visitedLinkIndex);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             // Check if this neighbor is a child of the link according to this traversal
             if( subModelTraversal.isParentOf(visitedLinkIndex,neighborIndex) )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     // If we reach this point of the code, something is really really wrong
     assert(false);
     return Wrench::Zero();
}